

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall OpenMD::SelectionSet::size(SelectionSet *this)

{
  size_t sVar1;
  reference pvVar2;
  allocator_type *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int local_28;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffee;
  this_00 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x289109);
  std::vector<int,_std::allocator<int>_>::vector(this_01,(size_type)this_00,in_RSI);
  std::allocator<int>::~allocator((allocator<int> *)0x289129);
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)in_RSI,
               (long)local_28);
    sVar1 = OpenMDBitSet::size((OpenMDBitSet *)0x28914f);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_28);
    *pvVar2 = (value_type)sVar1;
  }
  return in_RDI;
}

Assistant:

std::vector<int> SelectionSet::size() const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].size();
    return result;
  }